

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O0

void anon_unknown.dwarf_23dc62::check<unsigned_char>(istream *is,uchar c)

{
  char *pcVar1;
  ostream *poVar2;
  uchar in_SIL;
  uchar v;
  uchar *in_stack_ffffffffffffffe8;
  undefined6 in_stack_fffffffffffffff0;
  uchar in_stack_fffffffffffffff6;
  
  Imf_3_2::Xdr::read<(anonymous_namespace)::CharIO,std::istream>
            ((basic_istream<char,_std::char_traits<char>_> *)
             CONCAT17(in_SIL,CONCAT16(in_stack_fffffffffffffff6,in_stack_fffffffffffffff0)),
             in_stack_ffffffffffffffe8);
  pcVar1 = std::type_info::name((type_info *)&unsigned_char::typeinfo);
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar1);
  poVar2 = std::operator<<(poVar2,": expected ");
  poVar2 = std::operator<<(poVar2,in_SIL);
  poVar2 = std::operator<<(poVar2,", got ");
  poVar2 = std::operator<<(poVar2,in_stack_fffffffffffffff6);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  if (in_SIL == in_stack_fffffffffffffff6) {
    return;
  }
  __assert_fail("c == v",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testXdr.cpp"
                ,99,"void (anonymous namespace)::check(istream &, T) [T = unsigned char]");
}

Assistant:

void
check (istream& is, T c)
{
    T v;

    Xdr::read<CharIO> (is, v);
    cout << typeid (v).name () << ": expected " << c << ", got " << v << endl;
    assert (c == v);
}